

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O3

fdb_status docio_init(docio_handle *handle,filemgr *file,bool compress_document_body)

{
  void **__memptr;
  int iVar1;
  
  handle->file = file;
  handle->curblock = 0xffffffffffffffff;
  handle->curpos = 0;
  handle->cur_bmp_revnum_hash = 0;
  handle->lastbid = 0xffffffffffffffff;
  handle->lastBmpRevnum = 0;
  handle->compress_document_body = compress_document_body;
  __memptr = &handle->readbuffer;
  iVar1 = posix_memalign(__memptr,0x200,(ulong)file->blocksize);
  if (iVar1 == 0) {
    if (*__memptr != (void *)0x0) {
      return FDB_RESULT_SUCCESS;
    }
  }
  else {
    *__memptr = (void *)0x0;
  }
  fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
               ,"docio_init",0x30,"(docio_init) malloc_align failed: database file \'%s\'\n",
               handle->file->filename);
  return FDB_RESULT_ALLOC_FAIL;
}

Assistant:

fdb_status docio_init(struct docio_handle *handle,
                      struct filemgr *file,
                      bool compress_document_body)
{
    handle->file = file;
    handle->curblock = BLK_NOT_FOUND;
    handle->curpos = 0;
    handle->cur_bmp_revnum_hash = 0;
    handle->lastbid = BLK_NOT_FOUND;
    handle->lastBmpRevnum = 0;
    handle->compress_document_body = compress_document_body;
    malloc_align(handle->readbuffer, FDB_SECTOR_SIZE, file->blocksize);
    if (!handle->readbuffer) {
        fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                "(docio_init) malloc_align failed: "
                "database file '%s'\n",
                handle->file->filename);
        return FDB_RESULT_ALLOC_FAIL;
    }
    return FDB_RESULT_SUCCESS;
}